

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btInternalEdgeUtility.cpp
# Opt level: O1

bool btClampNormal(btVector3 *edge,btVector3 *tri_normal_org,btVector3 *localContactNormalOnB,
                  btScalar correctedEdgeAngle,btVector3 *clampedLocalNormal)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btQuaternion local_58;
  btMatrix3x3 local_48;
  
  fVar4 = tri_normal_org->m_floats[0];
  fVar5 = tri_normal_org->m_floats[1];
  fVar6 = tri_normal_org->m_floats[2];
  fVar8 = edge->m_floats[1] * fVar6 - fVar5 * edge->m_floats[2];
  fVar9 = edge->m_floats[2] * fVar4 - fVar6 * edge->m_floats[0];
  fVar7 = edge->m_floats[0] * fVar5 - fVar4 * edge->m_floats[1];
  fVar3 = fVar7 * fVar7 + fVar8 * fVar8 + fVar9 * fVar9;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = 1.0 / fVar3;
  fVar4 = atan2f(fVar7 * fVar3 * localContactNormalOnB->m_floats[2] +
                 fVar8 * fVar3 * localContactNormalOnB->m_floats[0] +
                 fVar9 * fVar3 * localContactNormalOnB->m_floats[1],
                 fVar6 * localContactNormalOnB->m_floats[2] +
                 fVar4 * localContactNormalOnB->m_floats[0] +
                 fVar5 * localContactNormalOnB->m_floats[1]);
  if ((0.0 <= correctedEdgeAngle) || (correctedEdgeAngle <= fVar4)) {
    if (correctedEdgeAngle < 0.0) {
      return false;
    }
    if (fVar4 <= correctedEdgeAngle) {
      return false;
    }
  }
  fVar5 = edge->m_floats[2] * edge->m_floats[2] +
          edge->m_floats[0] * edge->m_floats[0] + edge->m_floats[1] * edge->m_floats[1];
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar3 = (correctedEdgeAngle - fVar4) * 0.5;
  fVar6 = sinf(fVar3);
  fVar6 = fVar6 / fVar5;
  fVar4 = edge->m_floats[2];
  uVar1 = *(undefined8 *)edge->m_floats;
  local_58.super_btQuadWord.m_floats[3] = cosf(fVar3);
  local_58.super_btQuadWord.m_floats[1] = fVar6 * (float)((ulong)uVar1 >> 0x20);
  local_58.super_btQuadWord.m_floats[0] = fVar6 * (float)uVar1;
  local_58.super_btQuadWord.m_floats[2] = fVar4 * fVar6;
  btMatrix3x3::setRotation(&local_48,&local_58);
  fVar4 = localContactNormalOnB->m_floats[0];
  fVar5 = localContactNormalOnB->m_floats[1];
  fVar6 = localContactNormalOnB->m_floats[2];
  auVar2._4_4_ = fVar6 * local_48.m_el[1].m_floats[2] +
                 fVar4 * local_48.m_el[1].m_floats[0] + local_48.m_el[1].m_floats[1] * fVar5;
  auVar2._0_4_ = fVar6 * local_48.m_el[0].m_floats[2] +
                 fVar4 * local_48.m_el[0].m_floats[0] + local_48.m_el[0].m_floats[1] * fVar5;
  auVar2._8_4_ = fVar6 * local_48.m_el[2].m_floats[2] +
                 fVar4 * local_48.m_el[2].m_floats[0] + fVar5 * local_48.m_el[2].m_floats[1];
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])clampedLocalNormal->m_floats = auVar2;
  return true;
}

Assistant:

bool	btClampNormal(const btVector3& edge,const btVector3& tri_normal_org,const btVector3& localContactNormalOnB, btScalar correctedEdgeAngle, btVector3 & clampedLocalNormal)
{
	btVector3 tri_normal = tri_normal_org;
	//we only have a local triangle normal, not a local contact normal -> only normal in world space...
	//either compute the current angle all in local space, or all in world space

	btVector3 edgeCross = edge.cross(tri_normal).normalize();
	btScalar curAngle = btGetAngle(edgeCross,tri_normal,localContactNormalOnB);

	if (correctedEdgeAngle<0)
	{
		if (curAngle < correctedEdgeAngle)
		{
			btScalar diffAngle = correctedEdgeAngle-curAngle;
			btQuaternion rotation(edge,diffAngle );
			clampedLocalNormal = btMatrix3x3(rotation)*localContactNormalOnB;
			return true;
		}
	}

	if (correctedEdgeAngle>=0)
	{
		if (curAngle > correctedEdgeAngle)
		{
			btScalar diffAngle = correctedEdgeAngle-curAngle;
			btQuaternion rotation(edge,diffAngle );
			clampedLocalNormal = btMatrix3x3(rotation)*localContactNormalOnB;
			return true;
		}
	}
	return false;
}